

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeFalse<wasm::StructGet*>
          (ValidationInfo *this,bool result,StructGet *curr,char *text,Function *func)

{
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Function *local_38;
  Function *func_local;
  char *text_local;
  StructGet *curr_local;
  ValidationInfo *pVStack_18;
  bool result_local;
  ValidationInfo *this_local;
  
  if (result) {
    local_38 = func;
    func_local = (Function *)text;
    text_local = (char *)curr;
    curr_local._7_1_ = result;
    pVStack_18 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,text,&local_79);
    std::operator+(&local_58,"unexpected true: ",&local_78);
    fail<wasm::StructGet*,std::__cxx11::string>(this,&local_58,(StructGet *)text_local,local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return !result;
}

Assistant:

bool shouldBeFalse(bool result,
                     T curr,
                     const char* text,
                     Function* func = nullptr) {
    if (result) {
      fail("unexpected true: " + std::string(text), curr, func);
      return false;
    }
    return true;
  }